

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O3

void blake256_update(state_conflict *S,uint8_t *data,uint64_t datalen)

{
  uint32_t *puVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (7 < (uint)S->buflen) {
    iVar2 = S->buflen >> 3;
    uVar3 = 0x40 - iVar2;
    if (uVar3 <= ((uint)(datalen >> 3) & 0x3f)) {
      memcpy(S->buf + iVar2,data,(long)(int)uVar3);
      puVar1 = S->t;
      *puVar1 = *puVar1 + 0x200;
      if (*puVar1 == 0) {
        S->t[1] = S->t[1] + 1;
      }
      blake256_compress(S,S->buf);
      data = data + (int)uVar3;
      datalen = datalen - (long)(int)(uVar3 * 8);
      iVar2 = 0;
    }
  }
  for (; 0x1ff < datalen; datalen = datalen - 0x200) {
    puVar1 = S->t;
    *puVar1 = *puVar1 + 0x200;
    if (*puVar1 == 0) {
      S->t[1] = S->t[1] + 1;
    }
    blake256_compress(S,data);
    data = data + 0x40;
  }
  if (datalen == 0) {
    iVar2 = 0;
  }
  else {
    memcpy(S->buf + iVar2,data,datalen >> 3);
    iVar2 = (int)datalen + iVar2 * 8;
  }
  S->buflen = iVar2;
  return;
}

Assistant:

void blake256_update(state *S, const uint8_t *data, uint64_t datalen) {
    int left = S->buflen >> 3;
    int fill = 64 - left;

    if (left && (((datalen >> 3) & 0x3F) >= (unsigned) fill)) {
        memcpy((void *) (S->buf + left), (void *) data, fill);
        S->t[0] += 512;
        if (S->t[0] == 0) S->t[1]++;
        blake256_compress(S, S->buf);
        data += fill;
        datalen -= (fill << 3);
        left = 0;
    }

    while (datalen >= 512) {
        S->t[0] += 512;
        if (S->t[0] == 0) S->t[1]++;
        blake256_compress(S, data);
        data += 64;
        datalen -= 512;
    }

    if (datalen > 0) {
        memcpy((void *) (S->buf + left), (void *) data, datalen >> 3);
        S->buflen = (left << 3) + (int) datalen;
    } else {
        S->buflen = 0;
    }
}